

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

AppendResult __thiscall
metaf::TrendGroup::append
          (TrendGroup *this,string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  optional<metaf::TrendGroup> nextGroup;
  
  if ((this->t == NOSIG) ||
     (parse(&nextGroup,group,reportPart,reportMetadata),
     nextGroup.super__Optional_base<metaf::TrendGroup,_true,_true>._M_payload.
     super__Optional_payload_base<metaf::TrendGroup>._M_engaged != true)) {
    return NOT_APPENDED;
  }
  bVar1 = combineProbAndTrendTypeGroups(this,(TrendGroup *)&nextGroup);
  if (bVar1) {
    return APPENDED;
  }
  bVar1 = combineTrendTypeAndTimeGroup(this,(TrendGroup *)&nextGroup);
  if (bVar1) {
    return APPENDED;
  }
  bVar1 = combineProbAndTimeSpanGroups(this,(TrendGroup *)&nextGroup);
  if (bVar1) {
    return APPENDED;
  }
  bVar1 = combineIncompleteGroups(this,(TrendGroup *)&nextGroup);
  return (uint)!bVar1;
}

Assistant:

AppendResult TrendGroup::append(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	if (type() == Type::NOSIG) return AppendResult::NOT_APPENDED;
	const auto nextGroup = parse(group, reportPart, reportMetadata);
	if (!nextGroup.has_value()) return AppendResult::NOT_APPENDED;
	if (combineProbAndTrendTypeGroups(*nextGroup)) return AppendResult::APPENDED;
	if (combineTrendTypeAndTimeGroup(*nextGroup)) return AppendResult::APPENDED;
	if (combineProbAndTimeSpanGroups(*nextGroup)) return AppendResult::APPENDED;
	if (combineIncompleteGroups(*nextGroup)) return AppendResult::APPENDED;
	return AppendResult::NOT_APPENDED;
}